

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::removeItem
          (QGraphicsSceneBspTreeIndexPrivate *this,QGraphicsItem *item,bool recursive,
          bool moveToUnindexedItems)

{
  int iVar1;
  QGraphicsItem *item_00;
  pointer ppQVar2;
  QGraphicsItemPrivate *pQVar3;
  QList<QGraphicsItem_*> *c;
  ulong uVar4;
  long in_FS_OFFSET;
  QGraphicsItem *copy;
  QRectF local_68;
  QGraphicsItem *local_48;
  QHashDummyValue local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = item;
  if (item == (QGraphicsItem *)0x0) goto LAB_00632789;
  iVar1 = ((item->d_ptr).d)->index;
  if (iVar1 == -1) {
    c = &this->unindexedItems;
LAB_00632715:
    QtPrivate::sequential_erase_one<QList<QGraphicsItem*>,QGraphicsItem*>(c,&local_48);
  }
  else {
    local_68.xp = (qreal)CONCAT44(local_68.xp._4_4_,iVar1);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->freeItemIndexes,(this->freeItemIndexes).d.size,
               (int *)&local_68);
    QList<int>::end(&this->freeItemIndexes);
    iVar1 = ((local_48->d_ptr).d)->index;
    ppQVar2 = QList<QGraphicsItem_*>::data(&this->indexedItems);
    item_00 = local_48;
    ppQVar2[iVar1] = (QGraphicsItem *)0x0;
    pQVar3 = (local_48->d_ptr).d;
    pQVar3->index = -1;
    uVar4 = *(ulong *)&pQVar3->field_0x160;
    if ((uVar4 & 0x2000040000) != 0) {
      c = &this->untransformableItems;
      goto LAB_00632715;
    }
    if ((uVar4 >> 0x37 & 1) == 0) {
      if ((uVar4 & 0x120000) == 0) {
        QGraphicsItemPrivate::sceneEffectiveBoundingRect(&local_68,(local_48->d_ptr).d);
        QGraphicsSceneBspTree::removeItem(&this->bsp,item_00,&local_68);
      }
    }
    else {
      this->purgePending = true;
      local_68.xp = (qreal)local_48;
      QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QGraphicsItem*,QHashDummyValue> *)&this->removedItems,
                 (QGraphicsItem **)&local_68,&local_39);
    }
  }
  invalidateSortCache(this);
  if (moveToUnindexedItems) {
    addItem(this,local_48,false);
  }
  if ((recursive) && (pQVar3 = (local_48->d_ptr).d, (pQVar3->children).d.size != 0)) {
    uVar4 = 0;
    do {
      removeItem(this,(pQVar3->children).d.ptr[uVar4],true,moveToUnindexedItems);
      uVar4 = uVar4 + 1;
      pQVar3 = (local_48->d_ptr).d;
    } while (uVar4 < (ulong)(pQVar3->children).d.size);
  }
LAB_00632789:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::removeItem(QGraphicsItem *item, bool recursive,
                                                   bool moveToUnindexedItems)
{
    if (!item)
        return;

    if (item->d_ptr->index != -1) {
        Q_ASSERT(item->d_ptr->index < indexedItems.size());
        Q_ASSERT(indexedItems.at(item->d_ptr->index) == item);
        Q_ASSERT(!item->d_ptr->itemDiscovered);
        freeItemIndexes << item->d_ptr->index;
        indexedItems[item->d_ptr->index] = 0;
        item->d_ptr->index = -1;

        if (item->d_ptr->itemIsUntransformable()) {
            untransformableItems.removeOne(item);
        } else if (item->d_ptr->inDestructor) {
            // Avoid virtual function calls from the destructor.
            purgePending = true;
            removedItems << item;
        } else if (!(item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                     || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)) {
            bsp.removeItem(item, item->d_ptr->sceneEffectiveBoundingRect());
        }
    } else {
        unindexedItems.removeOne(item);
    }
    invalidateSortCache(); // ### Only do this when removing from BSP?

    Q_ASSERT(item->d_ptr->index == -1);
    Q_ASSERT(!indexedItems.contains(item));
    Q_ASSERT(!unindexedItems.contains(item));
    Q_ASSERT(!untransformableItems.contains(item));

    if (moveToUnindexedItems)
        addItem(item);

    if (recursive) {
        for (int i = 0; i < item->d_ptr->children.size(); ++i)
            removeItem(item->d_ptr->children.at(i), recursive, moveToUnindexedItems);
    }
}